

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O3

uchar * __thiscall MD5::MD5(MD5 *this,uchar *d,size_t n,uchar *md)

{
  this->finalized = false;
  this->count[0] = 0;
  this->count[1] = 0;
  this->state[0] = 0x67452301;
  this->state[1] = 0xefcdab89;
  this->state[2] = 0x98badcfe;
  this->state[3] = 0x10325476;
  return (uchar *)0x1032547698badcfe;
}

Assistant:

void MD5::init()
{
  finalized=false;
 
  count[0] = 0;
  count[1] = 0;
 
  // load magic initialization constants.
  state[0] = 0x67452301;
  state[1] = 0xefcdab89;
  state[2] = 0x98badcfe;
  state[3] = 0x10325476;
}